

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O0

void adios2::utils::print_decomp_singlestep<long>(Engine *fp,IO *io,Variable<long> *variable)

{
  uint uVar1;
  value_type vVar2;
  value_type vVar3;
  long lVar4;
  FILE *pFVar5;
  void *pvVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  undefined8 uVar10;
  size_type sVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  long in_RDX;
  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  *in_RSI;
  long *in_RDI;
  size_t k_1;
  size_t j_1;
  size_t stepRelative;
  size_t k;
  int ndigits_dims [32];
  size_t ndim;
  size_t j;
  int maxcols;
  int col;
  int ndigits_nblocks;
  size_t blocksSize;
  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  coreBlocks;
  MinVarInfo *minBlocks;
  DataType adiosvartype;
  Dims *in_stack_00000260;
  size_t in_stack_00000268;
  size_t in_stack_00000270;
  Variable<long> *in_stack_00000278;
  IO *in_stack_00000280;
  Engine *in_stack_00000288;
  Dims *in_stack_000002a0;
  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  *in_stack_fffffffffffffdd8;
  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  *in_stack_fffffffffffffde0;
  FILE *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe24;
  ulong local_138;
  ulong local_130;
  size_type local_120;
  uint local_118 [5];
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  DataType in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  void *in_stack_ffffffffffffff08;
  size_type local_88;
  int local_7c;
  int local_78;
  ulong local_70;
  Variable local_58 [24];
  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  local_40;
  void *local_28;
  int local_1c;
  long local_18;
  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  *local_10;
  long *local_8;
  
  local_1c = *(int *)(in_RDX + 0x28);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar10 = (**(code **)(*in_RDI + 0x20))();
  local_28 = (void *)(**(code **)(*in_RDI + 0x58))(in_RDI,in_RDX,uVar10);
  std::
  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  ::vector((vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
            *)0x18d26d);
  if (local_28 == (void *)0x0) {
    (**(code **)(*local_8 + 0x20))();
    adios2::core::Engine::BlocksInfo<long>(local_58,(ulong)local_8);
    std::
    vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
    ::operator=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::
    vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
    ::~vector(in_stack_fffffffffffffde0);
  }
  if ((local_28 != (void *)0x0) ||
     (bVar7 = std::
              vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
              ::empty(in_stack_fffffffffffffde0), !bVar7)) {
    if (local_28 == (void *)0x0) {
      local_70 = std::
                 vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                 ::size(&local_40);
    }
    else {
      local_70 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::size
                           ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                            ((long)local_28 + 0x20));
    }
    uVar8 = ndigits(0x18d38d);
    if ((*(int *)(local_18 + 0x40) == 1) || (*(int *)(local_18 + 0x40) == 4)) {
      if ((dump & 1) != 0) {
        local_78 = 0;
        local_7c = ncols;
        if (local_1c == 0xe) {
          local_7c = 1;
        }
        for (local_88 = 0; local_88 < local_70; local_88 = local_88 + 1) {
          if ((local_78 == 0) && ((noindex & 1) == 0)) {
            fprintf(outf,"    (%*zu)    ",(ulong)uVar8,local_88);
          }
          if (local_28 == (void *)0x0) {
            std::
            vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
            ::operator[](&local_40,local_88);
            print_data(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                       ,(bool)in_stack_fffffffffffffeff,(bool)in_stack_fffffffffffffefe);
          }
          else {
            std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::operator[]
                      ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                       ((long)local_28 + 0x20),local_88);
            print_data(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                       ,(bool)in_stack_fffffffffffffeff,(bool)in_stack_fffffffffffffefe);
          }
          local_78 = local_78 + 1;
          if (local_88 < local_70 - 1) {
            if (local_78 < local_7c) {
              fprintf(outf," ");
            }
            else {
              local_78 = 0;
              fprintf(outf,"\n");
            }
          }
        }
        fprintf(outf,"\n");
      }
    }
    else {
      sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_18 + 0x88)
                         );
      memcpy(local_118,&DAT_00202340,0x80);
      for (local_120 = 0; local_120 < sVar11; local_120 = local_120 + 1) {
        if (*(int *)(local_18 + 0x40) == 2) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_18 + 0x58),
                     local_120);
          uVar9 = ndigits(0x18d5fe);
          local_118[local_120] = uVar9;
        }
        else {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_18 + 0x88),
                     local_120);
          uVar9 = ndigits(0x18d639);
          local_118[local_120] = uVar9;
        }
      }
      for (local_130 = 0; pvVar6 = local_28, local_130 < local_70; local_130 = local_130 + 1) {
        fprintf(outf,"%c         block %*zu: [",(ulong)(uint)(int)commentchar,(ulong)uVar8,local_130
               );
        sVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            (local_18 + 0x88));
        for (local_138 = 0; local_138 < sVar11; local_138 = local_138 + 1) {
          if (local_28 == (void *)0x0) {
            pvVar12 = std::
                      vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                      ::operator[](&local_40,local_130);
            pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&pvVar12->Count,local_138);
            pFVar5 = outf;
            if (*pvVar13 == 0) {
              fprintf(outf,"%-*s",(ulong)(local_118[local_138] * 2 + 1),"null");
            }
            else if (*(int *)(local_18 + 0x40) == 2) {
              uVar9 = local_118[local_138];
              pvVar12 = std::
                        vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                        ::operator[](&local_40,local_130);
              pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  (&pvVar12->Start,local_138);
              vVar2 = *pvVar13;
              uVar1 = local_118[local_138];
              pvVar12 = std::
                        vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                        ::operator[](&local_40,local_130);
              pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  (&pvVar12->Start,local_138);
              vVar3 = *pvVar13;
              pvVar12 = std::
                        vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                        ::operator[](&local_40,local_130);
              pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  (&pvVar12->Count,local_138);
              fprintf(pFVar5,"%*zu:%*zu",(ulong)uVar9,vVar2,(ulong)uVar1,vVar3 + *pvVar13 + -1);
            }
            else {
              uVar9 = local_118[local_138];
              pvVar12 = std::
                        vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
                        ::operator[](&local_40,local_130);
              pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  (&pvVar12->Count,local_138);
              fprintf(pFVar5,"0:%*zu",(ulong)uVar9,*pvVar13 - 1);
            }
          }
          else {
            pvVar14 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                      operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>
                                  *)((long)local_28 + 0x20),local_130);
            pFVar5 = outf;
            if (*(long *)(*(long *)(pvVar14 + 0x18) + local_138 * 8) == 0) {
              fprintf(outf,"%-*s",(ulong)(local_118[local_138] * 2 + 1),"null");
            }
            else if (*(int *)(local_18 + 0x40) == 2) {
              in_stack_fffffffffffffe24 = local_118[local_138];
              in_stack_fffffffffffffe18 = outf;
              pvVar14 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                        operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>
                                    *)((long)local_28 + 0x20),local_130);
              uVar10 = *(undefined8 *)(*(long *)(pvVar14 + 0x10) + local_138 * 8);
              uVar9 = local_118[local_138];
              pvVar14 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                        operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>
                                    *)((long)local_28 + 0x20),local_130);
              lVar4 = *(long *)(*(long *)(pvVar14 + 0x10) + local_138 * 8);
              pvVar14 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                        operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>
                                    *)((long)local_28 + 0x20),local_130);
              fprintf(in_stack_fffffffffffffe18,"%*zu:%*zu",(ulong)in_stack_fffffffffffffe24,uVar10,
                      (ulong)uVar9,lVar4 + *(long *)(*(long *)(pvVar14 + 0x18) + local_138 * 8) + -1
                     );
            }
            else {
              uVar9 = local_118[local_138];
              pvVar14 = std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
                        operator[]((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>
                                    *)((long)local_28 + 0x20),local_130);
              fprintf(pFVar5,"0:%*zu",(ulong)uVar9,
                      *(long *)(*(long *)(pvVar14 + 0x18) + local_138 * 8) + -1);
            }
          }
          if (local_138 < sVar11 - 1) {
            fprintf(outf,", ");
          }
        }
        fprintf(outf,"]");
        if ((longopt & 1) != 0) {
          if (local_28 == (void *)0x0) {
            fprintf(outf," = ");
            std::
            vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
            ::operator[](&local_40,local_130);
            print_data(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                       ,(bool)in_stack_fffffffffffffeff,(bool)in_stack_fffffffffffffefe);
            fprintf(outf," / ");
            std::
            vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
            ::operator[](&local_40,local_130);
            print_data(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                       ,(bool)in_stack_fffffffffffffeff,(bool)in_stack_fffffffffffffefe);
          }
          else {
            fprintf(outf," = ");
            std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::operator[]
                      ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                       ((long)local_28 + 0x20),local_130);
            print_data(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                       ,(bool)in_stack_fffffffffffffeff,(bool)in_stack_fffffffffffffefe);
            fprintf(outf," / ");
            std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::operator[]
                      ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                       ((long)local_28 + 0x20),local_130);
            print_data(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                       ,(bool)in_stack_fffffffffffffeff,(bool)in_stack_fffffffffffffefe);
          }
        }
        fprintf(outf,"\n");
        if (((dump & 1) != 0) && (local_28 == (void *)0x0)) {
          in_stack_fffffffffffffde0 = local_10;
          std::
          vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
          ::operator[](&local_40,local_130);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffe18);
          std::
          vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
          ::operator[](&local_40,local_130);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffe18);
          readVarBlock<long>(in_stack_00000288,in_stack_00000280,in_stack_00000278,in_stack_00000270
                             ,in_stack_00000268,in_stack_00000260,in_stack_000002a0);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffde0);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffde0);
        }
      }
      if ((local_28 != (void *)0x0) && (local_28 != (void *)0x0)) {
        MinVarInfo::~MinVarInfo((MinVarInfo *)0x18de14);
        operator_delete(pvVar6);
      }
    }
  }
  std::
  vector<adios2::core::Variable<long>::BPInfo,_std::allocator<adios2::core::Variable<long>::BPInfo>_>
  ::~vector(in_stack_fffffffffffffde0);
  return;
}

Assistant:

void print_decomp_singlestep(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    /* Print block info */
    DataType adiosvartype = variable->m_Type;
    const auto minBlocks = fp->MinBlocksInfo(*variable, fp->CurrentStep());

    std::vector<typename core::Variable<T>::BPInfo> coreBlocks;

    if (!minBlocks)
    {
        coreBlocks = fp->BlocksInfo(*variable, fp->CurrentStep());
    }
    if (!minBlocks && coreBlocks.empty())
    {
        return;
    }

    size_t blocksSize;
    if (minBlocks)
    {
        blocksSize = minBlocks->BlocksInfo.size();
    }
    else
    {
        blocksSize = coreBlocks.size();
    }
    const int ndigits_nblocks = ndigits(blocksSize - 1);

    if (variable->m_ShapeID == ShapeID::GlobalValue || variable->m_ShapeID == ShapeID::LocalValue)
    {
        // scalars
        if (dump)
        {
            int col = 0;
            int maxcols = ncols;
            if (adiosvartype == DataType::String)
            {
                maxcols = 1;
            }
            for (size_t j = 0; j < blocksSize; j++)
            {
                if (col == 0 && !noindex)
                {
                    fprintf(outf, "    (%*zu)    ", ndigits_nblocks, j);
                }
                if (!minBlocks)
                    print_data(&coreBlocks[j].Value, 0, adiosvartype, true);
                else
                    print_data(&minBlocks->BlocksInfo[j].BufferP, 0, adiosvartype, true);
                ++col;
                if (j < blocksSize - 1)
                {
                    if (col < maxcols)
                    {
                        fprintf(outf, " ");
                    }
                    else
                    {
                        col = 0;
                        fprintf(outf, "\n");
                    }
                }
            }
            fprintf(outf, "\n");
        }
        return;
    }
    else
    {
        // arrays
        size_t ndim = variable->m_Count.size();
        int ndigits_dims[32] = {
            8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8,
            8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8,
        };
        for (size_t k = 0; k < ndim; k++)
        {
            // get digit lengths for each dimension
            if (variable->m_ShapeID == ShapeID::GlobalArray)
            {
                ndigits_dims[k] = ndigits(variable->m_Shape[k] - 1);
            }
            else
            {
                ndigits_dims[k] = ndigits(variable->m_Count[k] - 1);
            }
        }

        size_t stepRelative = 0;

        for (size_t j = 0; j < blocksSize; j++)
        {
            fprintf(outf, "%c         block %*zu: [", commentchar, ndigits_nblocks, j);

            // just in case ndim for a block changes in LocalArrays:
            ndim = variable->m_Count.size();

            for (size_t k = 0; k < ndim; k++)
            {
                if (!minBlocks)
                {
                    if (coreBlocks[j].Count[k])
                    {
                        if (variable->m_ShapeID == ShapeID::GlobalArray)
                        {
                            fprintf(outf, "%*zu:%*zu", ndigits_dims[k], coreBlocks[j].Start[k],
                                    ndigits_dims[k],
                                    coreBlocks[j].Start[k] + coreBlocks[j].Count[k] - 1);
                        }
                        else
                        {
                            // blockStart is empty vector for LocalArrays
                            fprintf(outf, "0:%*zu", ndigits_dims[k], coreBlocks[j].Count[k] - 1);
                        }
                    }
                    else
                    {
                        fprintf(outf, "%-*s", 2 * ndigits_dims[k] + 1, "null");
                    }
                }
                else
                {
                    if (minBlocks->BlocksInfo[j].Count[k])
                    {
                        if (variable->m_ShapeID == ShapeID::GlobalArray)
                        {
                            fprintf(outf, "%*zu:%*zu", ndigits_dims[k],
                                    minBlocks->BlocksInfo[j].Start[k], ndigits_dims[k],
                                    minBlocks->BlocksInfo[j].Start[k] +
                                        minBlocks->BlocksInfo[j].Count[k] - 1);
                        }
                        else
                        {
                            // blockStart is empty vector for LocalArrays
                            fprintf(outf, "0:%*zu", ndigits_dims[k],
                                    minBlocks->BlocksInfo[j].Count[k] - 1);
                        }
                    }
                    else
                    {
                        fprintf(outf, "%-*s", 2 * ndigits_dims[k] + 1, "null");
                    }
                }
                if (k < ndim - 1)
                    fprintf(outf, ", ");
            }
            fprintf(outf, "]");

            /* Print per-block statistics if available */
            if (longopt)
            {
                if (true /* TODO: variable->has_minmax */)
                {
                    if (!minBlocks)
                    {
                        fprintf(outf, " = ");
                        print_data(&coreBlocks[j].Min, 0, adiosvartype, false);

                        fprintf(outf, " / ");
                        print_data(&coreBlocks[j].Max, 0, adiosvartype, false);
                    }
                    else
                    {
                        fprintf(outf, " = ");
                        print_data(&minBlocks->BlocksInfo[j].MinMax.MinUnion, 0, adiosvartype,
                                   false);

                        fprintf(outf, " / ");
                        print_data(&minBlocks->BlocksInfo[j].MinMax.MaxUnion, 0, adiosvartype,
                                   false);
                    }
                }
                else
                {
                    fprintf(outf, "N/A / N/A");
                }
            }
            fprintf(outf, "\n");
            if (dump)
            {
                if (!minBlocks)
                {
                    readVarBlock(fp, io, variable, stepRelative, j, coreBlocks[j].Count,
                                 coreBlocks[j].Start);
                }
                else
                {
                    // GSE todo
                }
            }
        }
        ++stepRelative;
    }
    if (minBlocks)
        delete minBlocks;
}